

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O1

REF_STATUS ref_face_spanning(REF_FACE ref_face,REF_INT node0,REF_INT node1,REF_INT *face)

{
  uint uVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  ulong uVar5;
  REF_INT RVar6;
  
  *face = -1;
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < ref_face->adj->nnode) {
      uVar5 = (ulong)(uint)ref_face->adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 != -1) {
    RVar6 = ref_face->adj->item[(int)uVar5].ref;
    pRVar3 = ref_face->f2n;
    do {
      uVar1 = RVar6 * 4;
      if (((((pRVar3[(int)uVar1] == node0) || (pRVar3[(int)(uVar1 | 1)] == node0)) ||
           (pRVar3[(int)(uVar1 | 2)] == node0)) || (pRVar3[(int)(uVar1 | 3)] == node0)) &&
         (((pRVar3[(int)uVar1] == node1 || (pRVar3[(int)(uVar1 | 1)] == node1)) ||
          ((pRVar3[(int)(uVar1 | 2)] == node1 || (pRVar3[(int)(uVar1 | 3)] == node1)))))) {
        *face = RVar6;
        return 0;
      }
      pRVar4 = ref_face->adj->item;
      iVar2 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar2;
      if (uVar5 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar4[uVar5].ref;
      }
    } while (iVar2 != -1);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_face_spanning(REF_FACE ref_face, REF_INT node0,
                                     REF_INT node1, REF_INT *face) {
  REF_INT item, ref;

  (*face) = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), node0, item, ref) {
    if ((node0 == ref_face_f2n(ref_face, 0, ref) ||
         node0 == ref_face_f2n(ref_face, 1, ref) ||
         node0 == ref_face_f2n(ref_face, 2, ref) ||
         node0 == ref_face_f2n(ref_face, 3, ref)) &&
        (node1 == ref_face_f2n(ref_face, 0, ref) ||
         node1 == ref_face_f2n(ref_face, 1, ref) ||
         node1 == ref_face_f2n(ref_face, 2, ref) ||
         node1 == ref_face_f2n(ref_face, 3, ref))) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}